

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b3D_integrator.cpp
# Opt level: O1

double __thiscall
NetworkNS::cb3D_integrator::bonded_force_calculation(cb3D_integrator *this,bool stress_calc)

{
  uint uVar1;
  double **ppdVar2;
  double *pdVar3;
  NetwMin *pNVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  _List_node_base *p_Var8;
  long lVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  double sep_vec [3];
  double grada [3];
  double gradb [3];
  double local_b8;
  double local_b0;
  double local_a8 [2];
  double local_98;
  double local_90;
  double local_88;
  cb3D_integrator *local_78;
  double *local_70;
  long local_68;
  long local_60;
  _List_node_base *local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  local_78 = this;
  if ((ulong)this->dofs_3N != 0) {
    memset(this->bd_f,0,(ulong)this->dofs_3N << 3);
  }
  if ((stress_calc) && (uVar1 = local_78->dofs, (ulong)uVar1 != 0)) {
    ppdVar2 = local_78->bd_stress;
    uVar6 = 0;
    do {
      pdVar3 = ppdVar2[uVar6];
      pdVar3[4] = 0.0;
      pdVar3[5] = 0.0;
      pdVar3[2] = 0.0;
      pdVar3[3] = 0.0;
      *pdVar3 = 0.0;
      pdVar3[1] = 0.0;
      uVar6 = uVar6 + 1;
    } while (uVar1 != uVar6);
  }
  pNVar4 = local_78->cur_bd_net;
  p_Var8 = (pNVar4->network->strands).super__List_base<sStrand,_std::allocator<sStrand>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var8 == (_List_node_base *)&pNVar4->network->strands) {
    local_50 = 0.0;
  }
  else {
    local_70 = &local_78->bd_temp;
    local_50 = 0.0;
    do {
      lVar7 = (long)**(int **)p_Var8[4]._M_next + -1;
      lVar5 = (long)**(int **)((long)p_Var8[4]._M_next + 8) + -1;
      pdVar3 = local_78->bd_x;
      local_b8 = pdVar3[lVar5 * 3] - pdVar3[lVar7 * 3];
      lVar9 = (long)((int)lVar5 * 3);
      lVar10 = (long)((int)lVar7 * 3);
      local_b0 = pdVar3[lVar9 + 1] - pdVar3[lVar10 + 1];
      local_a8[0] = pdVar3[lVar9 + 2] - pdVar3[lVar10 + 2];
      local_68 = lVar7;
      local_60 = lVar5;
      Domain::minimum_image(pNVar4->domain,&local_b8,&local_b0,local_a8);
      local_58 = p_Var8;
      dVar11 = f_gaussian(&local_b8,(double *)((long)(p_Var8 + 2) + 8),(double *)(p_Var8 + 3),
                          local_70,&local_98,&local_48);
      pdVar3 = local_78->bd_f;
      pdVar3[lVar7 * 3] = local_98 + pdVar3[lVar7 * 3];
      pdVar3[lVar10 + 1] = local_90 + pdVar3[lVar10 + 1];
      pdVar3[lVar10 + 2] = local_88 + pdVar3[lVar10 + 2];
      pdVar3[lVar5 * 3] = local_48 + pdVar3[lVar5 * 3];
      pdVar3[lVar9 + 1] = local_40 + pdVar3[lVar9 + 1];
      pdVar3[lVar9 + 2] = local_38 + pdVar3[lVar9 + 2];
      if (stress_calc) {
        ppdVar2 = local_78->bd_stress;
        pdVar3 = ppdVar2[(int)local_68];
        *pdVar3 = local_b8 * 0.5 * local_98 + *pdVar3;
        pdVar3[1] = local_b0 * 0.5 * local_90 + pdVar3[1];
        pdVar3[2] = local_a8[0] * 0.5 * local_88 + pdVar3[2];
        dVar12 = local_b8 * 0.5;
        pdVar3[3] = local_90 * dVar12 + pdVar3[3];
        pdVar3[4] = dVar12 * local_88 + pdVar3[4];
        pdVar3[5] = local_b0 * 0.5 * local_88 + pdVar3[5];
        pdVar3 = ppdVar2[(int)local_60];
        *pdVar3 = dVar12 * local_98 + *pdVar3;
        pdVar3[1] = local_b0 * 0.5 * local_90 + pdVar3[1];
        pdVar3[2] = local_a8[0] * 0.5 * local_88 + pdVar3[2];
        pdVar3[3] = local_90 * local_b8 * 0.5 + pdVar3[3];
        pdVar3[4] = local_b8 * 0.5 * local_88 + pdVar3[4];
        pdVar3[5] = local_b0 * 0.5 * local_88 + pdVar3[5];
      }
      local_50 = local_50 + dVar11;
      p_Var8 = local_58->_M_next;
      pNVar4 = local_78->cur_bd_net;
    } while (p_Var8 != (_List_node_base *)&pNVar4->network->strands);
  }
  return local_50;
}

Assistant:

double cb3D_integrator::bonded_force_calculation(bool stress_calc) {

      double fenergy = 0.0; 
              
      // Initialize the forces to zero.
      for (unsigned int i = 0; i < dofs_3N; i++)
         bd_f[i] = 0.0;
      
      // Initialize the stresses to zero, if we have been asked for stress calculation:
      if (stress_calc)
         for (unsigned int i = 0; i < dofs; i++)
            for (unsigned int j = 0; j < 6; j++)
               bd_stress[i][j] = 0.0;
      

      int taga, taga3, tagb, tagb3;
      //double *sep_vec = (double*)malloc(3*sizeof(double));
      //double *grada   = (double*)malloc(3*sizeof(double));
      //double *gradb   = (double*)malloc(3*sizeof(double));

      double sep_vec[3], grada[3], gradb[3];
      
      for (std::list<tStrand>::iterator it = cur_bd_net->network->strands.begin();
              it != cur_bd_net->network->strands.end(); ++it) {
         
         /* Ask for the tags of the nodes connected to the current strand. */
         taga  = (*it).pEnds[0]->Id - 1;
         taga3 = 3*taga; 
         tagb =  (*it).pEnds[1]->Id - 1;
         tagb3 = 3*tagb;
         
         /* Form the "strand" vector, based on the x vector coming from
          * the minimizer. */
         sep_vec[0] = bd_x[tagb3 + 0] - bd_x[taga3 + 0];
         sep_vec[1] = bd_x[tagb3 + 1] - bd_x[taga3 + 1];
         sep_vec[2] = bd_x[tagb3 + 2] - bd_x[taga3 + 2];
         
         /* Apply minimum image convention. */
         cur_bd_net->domain->minimum_image(sep_vec[0], sep_vec[1], sep_vec[2]);

#ifdef FENE_SLS
         if ((*it).slip_spring)
            fenergy += f_fene( sep_vec, (*it).spring_coeff, 
                               (*it).sq_end_to_end, bd_temp, grada, gradb);
         else
#endif
         /* Calculate the spring's contribution to the free energy of the system.*/
         fenergy += f_gaussian( sep_vec, (*it).spring_coeff, 
                                (*it).sq_end_to_end, bd_temp, grada, gradb);
         
         // Accumulate the forces of the first atom:
         bd_f[taga3 + 0] += grada[0];
         bd_f[taga3 + 1] += grada[1];
         bd_f[taga3 + 2] += grada[2];
         // Accumulate the forces of the second atom:
         bd_f[tagb3 + 0] += gradb[0];
         bd_f[tagb3 + 1] += gradb[1];
         bd_f[tagb3 + 2] += gradb[2];

         /** The stress tensor of the atom @f$ i @f$, @f$\sigma_{i,\rm a,b} @f$ is given by the 
          *  following formula, where @f$\rm a@f$ and @f$\rm b @f$ take on values @f$ x @f$, 
          *  @f$ y @f$, @f$ z @f$ to generate the six components of the symmetric tensor:
          *  @f[ \sigma_{i,\rm a,b} = -\frac{1}{2}\sum_{j=1}^{N_{\rm b}(i)}
          *      \left(r_{i,a} - r_{j,a}\right)^{\rm min.im.} F_{ij,b}^{\rm min.im.}  @f]
          *  where @f$N_{\rm b}(i)@f$ stands for the number of bonds atom @f$ i @f$ participates to.
          */ 
         if (stress_calc) {
            bd_stress[taga][0] += 0.5 * sep_vec[0] * grada[0]; // xx
            bd_stress[taga][1] += 0.5 * sep_vec[1] * grada[1]; // yy
            bd_stress[taga][2] += 0.5 * sep_vec[2] * grada[2]; // zz
            bd_stress[taga][3] += 0.5 * sep_vec[0] * grada[1]; // xy
            bd_stress[taga][4] += 0.5 * sep_vec[0] * grada[2]; // xz
            bd_stress[taga][5] += 0.5 * sep_vec[1] * grada[2]; // yz

            bd_stress[tagb][0] += 0.5 * sep_vec[0] * grada[0];
            bd_stress[tagb][1] += 0.5 * sep_vec[1] * grada[1];
            bd_stress[tagb][2] += 0.5 * sep_vec[2] * grada[2];
            bd_stress[tagb][3] += 0.5 * sep_vec[0] * grada[1];
            bd_stress[tagb][4] += 0.5 * sep_vec[0] * grada[2];
            bd_stress[tagb][5] += 0.5 * sep_vec[1] * grada[2];
         }
      }

      
      
      
      return (fenergy);
   }